

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

bool isEmptyBlockBeforeTable(QTextBlock *block,QTextBlockFormat *format,Iterator *nextIt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTextTable *pQVar4;
  
  if (((((QObject *)nextIt->cf != (QObject *)0x0) || (nextIt->cb != nextIt->e)) &&
      (pQVar4 = QtPrivate::qobject_cast_helper<QTextTable*,QObject>((QObject *)nextIt->cf),
      pQVar4 != (QTextTable *)0x0)) &&
     (((bVar1 = QTextBlock::isValid(block), bVar1 && (iVar2 = QTextBlock::length(block), iVar2 == 1)
       ) && ((bVar1 = QTextFormat::hasProperty(&format->super_QTextFormat,0x1060), !bVar1 &&
             (bVar1 = QTextFormat::hasProperty(&format->super_QTextFormat,0x820), !bVar1)))))) {
    iVar2 = QTextFrame::firstPosition(nextIt->cf);
    iVar3 = QTextBlock::position(block);
    return iVar2 == iVar3 + 1;
  }
  return false;
}

Assistant:

static inline bool isEmptyBlockBeforeTable(const QTextBlock &block, const QTextBlockFormat &format, const QTextFrame::Iterator &nextIt)
{
    return !nextIt.atEnd()
           && qobject_cast<QTextTable *>(nextIt.currentFrame())
           && block.isValid()
           && block.length() == 1
           && !format.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth)
           && !format.hasProperty(QTextFormat::BackgroundBrush)
           && nextIt.currentFrame()->firstPosition() == block.position() + 1
           ;
}